

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

int __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForTextureFormat::init
          (shaderCollectionForTextureFormat *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  undefined8 *in_RCX;
  int *piVar4;
  long in_RDX;
  TextureCubeMapArraySamplingTest *this_00;
  TextureCubeMapArraySamplingTest *in_R8;
  pointer this_01;
  string pass_through_tesselation_evaluation_shader_source;
  string pass_through_fragment_shader_source;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70.field_2._M_local_buf[0] = '\0';
  this_00 = (TextureCubeMapArraySamplingTest *)this;
  getPassThroughFragmentShaderCode
            ((TextureCubeMapArraySamplingTest *)this,*(samplerType *)(in_RDX + 0x20),&local_50);
  getPassThroughTesselationEvaluationShaderCode(this_00,*(samplerType *)(in_RDX + 0x20),&local_70);
  shaderDefinition::init(&this->pass_through_fragment_shader,ctx);
  if ((in_R8->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    shaderDefinition::init(&this->pass_through_tesselation_evaluation_shader,ctx);
  }
  compile(in_R8,&this->pass_through_fragment_shader);
  if ((in_R8->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    compile(in_R8,&this->pass_through_tesselation_evaluation_shader);
  }
  uVar2 = 0;
  for (piVar4 = (int *)*in_RCX; piVar4 != (int *)in_RCX[1]; piVar4 = piVar4 + 4) {
    uVar2 = uVar2 + (*piVar4 - 3U < 0xfffffffe || *(int *)(in_RDX + 0x20) != 3);
  }
  std::
  vector<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
  ::resize(&this->per_sampling_routine,(ulong)uVar2);
  this_01 = (this->per_sampling_routine).
            super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar1 = (int *)in_RCX[1];
  for (piVar4 = (int *)*in_RCX; piVar4 != piVar1; piVar4 = piVar4 + 4) {
    if ((*(int *)(in_RDX + 0x20) != 3) || (*piVar4 - 3U < 0xfffffffe)) {
      shaderCollectionForSamplingRoutine::init(this_01,ctx);
      this_01 = this_01 + 1;
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
  iVar3 = std::__cxx11::string::~string((string *)&local_50);
  return iVar3;
}

Assistant:

void TextureCubeMapArraySamplingTest::shaderCollectionForTextureFormat::init(
	const glw::Functions& gl, const formatDefinition& format, const samplingFunctionsVectorType& sampling_routines,
	TextureCubeMapArraySamplingTest& test)
{
	std::string pass_through_fragment_shader_source;
	std::string pass_through_tesselation_evaluation_shader_source;
	glw::GLuint n_routines_supporting_format = 0;

	test.getPassThroughFragmentShaderCode(format.m_sampler_type, pass_through_fragment_shader_source);
	test.getPassThroughTesselationEvaluationShaderCode(format.m_sampler_type,
													   pass_through_tesselation_evaluation_shader_source);

	pass_through_fragment_shader.init(gl, GL_FRAGMENT_SHADER, pass_through_fragment_shader_source, &test);

	if (test.m_is_tessellation_shader_supported)
	{
		pass_through_tesselation_evaluation_shader.init(gl, test.m_glExtTokens.TESS_EVALUATION_SHADER,
														pass_through_tesselation_evaluation_shader_source, &test);
	}

	test.compile(pass_through_fragment_shader);

	if (test.m_is_tessellation_shader_supported)
	{
		test.compile(pass_through_tesselation_evaluation_shader);
	}

	for (samplingFunctionsVectorType::const_iterator it = sampling_routines.begin(), end = sampling_routines.end();
		 end != it; ++it)
	{
		if (TextureCubeMapArraySamplingTest::isSamplerSupportedByFunction(format.m_sampler_type, it->m_function))
		{
			n_routines_supporting_format += 1;
		}
	}

	per_sampling_routine.resize(n_routines_supporting_format);
	shaderCollectionForSamplingFunctionVectorType::iterator jt = per_sampling_routine.begin();

	for (samplingFunctionsVectorType::const_iterator it = sampling_routines.begin(), end = sampling_routines.end();
		 end != it; ++it)
	{
		if (TextureCubeMapArraySamplingTest::isSamplerSupportedByFunction(format.m_sampler_type, it->m_function))
		{
			jt->init(gl, format, it->m_function, test);
			++jt;
		}
	}
}